

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

int cs_impl::system_cs_ext::init(EVP_PKEY_CTX *ctx)

{
  long lVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  baseHolder *pbVar3;
  _func_int **pp_Var4;
  var local_210;
  var local_208;
  var local_200;
  var local_1f8;
  var local_1f0;
  var local_1e8;
  var local_1e0;
  var local_1d8;
  var local_1d0;
  var local_1c8;
  var local_1c0;
  var local_1b8;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  console_cs_ext::init(ctx);
  file_cs_ext::init(ctx);
  path_cs_ext::init(ctx);
  lVar1 = system_ext;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"console","");
  cs::make_namespace((cs *)&local_1c8,(namespace_t *)&console_ext);
  cs::domain_type::add_var(*(domain_type **)(lVar1 + 8),&local_f0,&local_1c8);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"file","");
  cs::make_namespace((cs *)&local_1d0,(namespace_t *)&file_ext);
  cs::domain_type::add_var(*(domain_type **)(lVar1 + 8),&local_110,&local_1d0);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"path","");
  cs::make_namespace((cs *)&local_1d8,(namespace_t *)&path_ext);
  cs::domain_type::add_var(*(domain_type **)(lVar1 + 8),&local_130,&local_1d8);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"in","");
  if ((DAT_0026a978 == 0) || (cs::global_thread_counter != 0)) {
    pbVar3 = (baseHolder *)operator_new(0x18);
  }
  else {
    pbVar3 = *(baseHolder **)
              (&any::holder<std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>>::
                allocator + DAT_0026a978 * 8);
    DAT_0026a978 = DAT_0026a978 + -1;
  }
  pbVar3->_vptr_baseHolder = (_func_int **)&PTR__holder_00260418;
  pbVar3[1]._vptr_baseHolder = (_func_int **)&std::cin;
  pbVar3[2]._vptr_baseHolder = (_func_int **)0x0;
  pp_Var4 = (_func_int **)operator_new(0x18);
  pp_Var4[1] = (_func_int *)0x100000001;
  *pp_Var4 = (_func_int *)&PTR___Sp_counted_base_00260d00;
  pp_Var4[2] = (_func_int *)&std::cin;
  pbVar3[2]._vptr_baseHolder = pp_Var4;
  if ((DAT_002680d0 == 0) || (cs::global_thread_counter != 0)) {
    local_1b8.mDat = (proxy *)operator_new(0x18);
  }
  else {
    local_1b8.mDat = (proxy *)(&cs::null_pointer)[DAT_002680d0];
    DAT_002680d0 = DAT_002680d0 + -1;
  }
  (local_1b8.mDat)->is_rvalue = false;
  (local_1b8.mDat)->protect_level = 1;
  (local_1b8.mDat)->refcount = 1;
  (local_1b8.mDat)->data = pbVar3;
  cs::domain_type::add_var(*(domain_type **)(lVar1 + 8),&local_150,&local_1b8);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"out","");
  if ((DAT_0026ab90 == 0) || (cs::global_thread_counter != 0)) {
    pbVar3 = (baseHolder *)operator_new(0x18);
  }
  else {
    pbVar3 = *(baseHolder **)
              (&any::holder<std::shared_ptr<std::istream>>::allocator + DAT_0026ab90 * 8);
    DAT_0026ab90 = DAT_0026ab90 + -1;
  }
  pbVar3->_vptr_baseHolder = (_func_int **)&PTR__holder_00260530;
  pbVar3[1]._vptr_baseHolder = (_func_int **)&std::cout;
  pbVar3[2]._vptr_baseHolder = (_func_int **)0x0;
  pp_Var4 = (_func_int **)operator_new(0x18);
  pp_Var4[1] = (_func_int *)0x100000001;
  *pp_Var4 = (_func_int *)&PTR___Sp_counted_base_00260d50;
  pp_Var4[2] = (_func_int *)&std::cout;
  pbVar3[2]._vptr_baseHolder = pp_Var4;
  if ((DAT_002680d0 == 0) || (cs::global_thread_counter != 0)) {
    local_1c0.mDat = (proxy *)operator_new(0x18);
  }
  else {
    local_1c0.mDat = (proxy *)(&cs::null_pointer)[DAT_002680d0];
    DAT_002680d0 = DAT_002680d0 + -1;
  }
  (local_1c0.mDat)->is_rvalue = false;
  (local_1c0.mDat)->protect_level = 1;
  (local_1c0.mDat)->refcount = 1;
  (local_1c0.mDat)->data = pbVar3;
  cs::domain_type::add_var(*(domain_type **)(lVar1 + 8),&local_170,&local_1c0);
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"run","");
  cs::make_cni<cs::numeric(&)(std::__cxx11::string_const&)>((cs *)&local_1e0,run,false);
  cs::domain_type::add_var(*(domain_type **)(lVar1 + 8),&local_190,&local_1e0);
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"getenv","");
  cs::make_cni<std::__cxx11::string(&)(std::__cxx11::string_const&)>((cs *)&local_1e8,getenv,false);
  cs::domain_type::add_var(*(domain_type **)(lVar1 + 8),&local_1b0,&local_1e8);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"exit","");
  cs::make_cni<void(&)(cs::numeric_const&)>((cs *)&local_1f0,exit,false);
  cs::domain_type::add_var(*(domain_type **)(lVar1 + 8),&local_50,&local_1f0);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"is_platform_windows","");
  cs::make_cni<bool(&)()>((cs *)&local_1f8,platform::is_platform_win32,false);
  cs::domain_type::add_var(*(domain_type **)(lVar1 + 8),&local_70,&local_1f8);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"is_platform_linux","");
  cs::make_cni<bool(&)()>((cs *)&local_200,platform::is_platform_linux,false);
  cs::domain_type::add_var(*(domain_type **)(lVar1 + 8),&local_90,&local_200);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"is_platform_darwin","");
  cs::make_cni<bool(&)()>((cs *)&local_208,platform::is_platform_darwin,false);
  cs::domain_type::add_var(*(domain_type **)(lVar1 + 8),&local_b0,&local_208);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"is_platform_unix","");
  cs::make_cni<bool(&)()>((cs *)&local_210,platform::is_platform_unix,false);
  cs::domain_type::add_var(*(domain_type **)(lVar1 + 8),&local_d0,&local_210);
  any::recycle(&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  any::recycle(&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  any::recycle(&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  any::recycle(&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  any::recycle(&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  any::recycle(&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  any::recycle(&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  any::recycle(&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  any::recycle(&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  any::recycle(&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  any::recycle(&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  any::recycle(&local_1c8);
  iVar2 = extraout_EAX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    iVar2 = extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

void init()
		{
			console_cs_ext::init();
			file_cs_ext::init();
			path_cs_ext::init();
			(*system_ext)
			.add_var("console", make_namespace(console_ext))
			.add_var("file", make_namespace(file_ext))
			.add_var("path", make_namespace(path_ext))
			.add_var("in", var::make_protect<istream>(&std::cin, [](std::istream *) {}))
			.add_var("out", var::make_protect<ostream>(&std::cout, [](std::ostream *) {}))
			.add_var("run", make_cni(run))
			.add_var("getenv", make_cni(getenv))
			.add_var("exit", make_cni(exit))
			.add_var("is_platform_windows", make_cni(platform::is_platform_win32))
			.add_var("is_platform_linux", make_cni(platform::is_platform_linux))
			.add_var("is_platform_darwin", make_cni(platform::is_platform_darwin))
			.add_var("is_platform_unix", make_cni(platform::is_platform_unix));
		}